

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O1

vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> * __thiscall
AssemblyCode::CJumpNotEqualCommand::GetIn
          (vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *__return_storage_ptr__,
          CJumpNotEqualCommand *this)

{
  pointer pcVar1;
  long lVar2;
  initializer_list<IRT::CTemp> __l;
  allocator_type local_69;
  CTemp local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_68.name._M_dataplus._M_p = (pointer)&local_68.name.field_2;
  pcVar1 = (this->leftOperand).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (this->leftOperand).name._M_string_length);
  local_48[0] = local_38;
  pcVar1 = (this->rightOperand).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + (this->rightOperand).name._M_string_length);
  __l._M_len = 2;
  __l._M_array = &local_68;
  std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::vector(__return_storage_ptr__,__l,&local_69)
  ;
  lVar2 = 0;
  do {
    if (local_38 + lVar2 != *(undefined1 **)((long)local_48 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_48 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<IRT::CTemp> AssemblyCode::CJumpNotEqualCommand::GetIn( ) const {
    return { leftOperand, rightOperand };
}